

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void VP8LConvertBGRAToBGR_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  
  puVar1 = src + num_pixels;
  for (; src < puVar1; src = src + 1) {
    uVar2 = *src;
    *dst = (uint8_t)uVar2;
    dst[1] = (uint8_t)(uVar2 >> 8);
    dst[2] = (uint8_t)(uVar2 >> 0x10);
    dst = dst + 3;
  }
  return;
}

Assistant:

void VP8LConvertBGRAToBGR_C(const uint32_t* WEBP_RESTRICT src,
                            int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    *dst++ = (argb >>  0) & 0xff;
    *dst++ = (argb >>  8) & 0xff;
    *dst++ = (argb >> 16) & 0xff;
  }
}